

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::AfterIfTrueExpr
          (ExprVisitorDelegate *this,IfExpr *expr)

{
  int *piVar1;
  WatWriter *pWVar2;
  Info local_48;
  
  if ((expr->false_).size_ != 0) {
    pWVar2 = this->writer_;
    piVar1 = &pWVar2->indent_;
    *piVar1 = *piVar1 + -2;
    if (*piVar1 < 0) {
      __assert_fail("indent_ >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wat-writer.cc"
                    ,0xe4,"void wabt::(anonymous namespace)::WatWriter::Dedent()");
    }
    Opcode::GetInfo(&local_48,(Opcode *)&Opcode::Else_Opcode);
    WritePuts(pWVar2,local_48.name,Space);
    pWVar2 = this->writer_;
    pWVar2->indent_ = pWVar2->indent_ + 2;
    if (pWVar2->next_char_ == ForceNewline) {
      WriteNextChar(pWVar2);
    }
    pWVar2->next_char_ = ForceNewline;
  }
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::AfterIfTrueExpr(IfExpr* expr) {
  if (!expr->false_.empty()) {
    writer_->Dedent();
    writer_->WritePutsSpace(Opcode::Else_Opcode.GetName());
    writer_->Indent();
    writer_->WriteNewline(FORCE_NEWLINE);
  }
  return Result::Ok;
}